

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionTagBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer __src;
  size_type sVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  reference pvVar4;
  pointer pEVar5;
  idx_t capacity;
  reference pvVar6;
  string *psVar7;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar8;
  InternalException *this_01;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar9;
  uint uVar10;
  idx_t index;
  long lVar11;
  anon_union_16_2_67f50693_for_value aVar12;
  string_t data;
  LogicalType enum_type;
  Vector varchar_vector;
  LogicalType local_d8;
  idx_t local_c0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_b8;
  Vector local_b0;
  LogicalType local_48;
  
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Missing required arguments for union_tag function.","");
    BinderException::BinderException(pBVar8,(string *)&local_b0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar9 = arguments;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if ((pEVar5->return_type).id_ == UNKNOWN) {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if ((pEVar5->return_type).id_ != UNION) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"First argument to union_tag function must be a union type.","");
    BinderException::BinderException(pBVar8,(string *)&local_b0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    local_b8._M_head_impl = (FunctionData *)this;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    capacity = UnionType::GetMemberCount(&pEVar5->return_type);
    if (capacity != 0) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments
                          ,0);
      if (pvVar6 != &pEVar5->return_type) {
        pvVar6->id_ = (pEVar5->return_type).id_;
        PVar1 = (pEVar5->return_type).physical_type_;
        pvVar9 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)CONCAT71((int7)((ulong)pvVar9 >> 8),PVar1);
        pvVar6->physical_type_ = PVar1;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar6->type_info_,&(pEVar5->return_type).type_info_);
      }
      LogicalType::LogicalType(&local_48,VARCHAR);
      Vector::Vector(&local_b0,&local_48,capacity);
      LogicalType::~LogicalType(&local_48);
      lVar11 = 8;
      index = 0;
      local_c0 = capacity;
      do {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        psVar7 = UnionType::GetMemberName_abi_cxx11_(&pEVar5->return_type,index);
        __src = (psVar7->_M_dataplus)._M_p;
        sVar2 = psVar7->_M_string_length;
        uVar10 = (uint)sVar2;
        local_d8.id_ = (LogicalTypeId)sVar2;
        local_d8.physical_type_ = (PhysicalType)(sVar2 >> 8);
        local_d8._2_2_ = SUB82(sVar2 >> 0x10,0);
        if (uVar10 < 0xd) {
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
          local_d8._4_4_ = 0;
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          if (uVar10 != 0) {
            switchD_012e1ce8::default(&local_d8.field_0x4,__src,(ulong)(uVar10 & 0xf));
          }
        }
        else {
          local_d8._4_1_ = __src[0];
          local_d8._5_1_ = __src[1];
          local_d8._6_1_ = __src[2];
          local_d8._7_1_ = __src[3];
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
               SUB84(__src,0);
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               (undefined4)((ulong)__src >> 0x20);
        }
        data.value._4_1_ =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_1_;
        data.value._5_1_ =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._5_1_;
        data.value._6_1_ =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_1_;
        data.value._7_1_ =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_;
        data.value.pointer.length =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
        aVar12.pointer.length._1_1_ = local_d8.physical_type_;
        aVar12.pointer.length._0_1_ = local_d8.id_;
        aVar12.pointer.length._2_2_ = local_d8._2_2_;
        aVar12._4_1_ = local_d8._4_1_;
        aVar12._5_1_ = local_d8._5_1_;
        aVar12._6_1_ = local_d8._6_1_;
        aVar12._7_1_ = local_d8._7_1_;
        aVar12._8_4_ = local_d8.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                       _0_4_;
        aVar12._12_4_ =
             local_d8.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
        if (0xc < uVar10) {
          data.value.pointer.ptr = (char *)pvVar9;
          aVar12.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddString
                         ((StringVector *)&local_b0,
                          (Vector *)
                          CONCAT44(local_d8._4_4_,
                                   CONCAT22(local_d8._2_2_,
                                            CONCAT11(local_d8.physical_type_,local_d8.id_))),data);
        }
        *(long *)((long)local_b0.data + lVar11 + -8) = aVar12._0_8_;
        *(char **)((long)&(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             *)local_b0.data)->
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar11) = aVar12.pointer.ptr;
        index = index + 1;
        lVar11 = lVar11 + 0x10;
        pvVar9 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_b0.data;
      } while (capacity + (capacity == 0) != index);
      LogicalType::ENUM(&local_d8,&local_b0,local_c0);
      if (&(bound_function->super_BaseScalarFunction).return_type != &local_d8) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = local_d8.id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             local_d8.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &local_d8.type_info_);
      }
      _Var3._M_head_impl = local_b8._M_head_impl;
      (local_b8._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
      LogicalType::~LogicalType(&local_d8);
      if (local_b0.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_b0.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_b0 + 8));
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             _Var3._M_head_impl;
    }
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Can\'t get tags from an empty union","");
    InternalException::InternalException(this_01,(string *)&local_b0);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
  local_b0._0_8_ = &local_b0.type.type_info_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Too many arguments, union_tag takes at most one argument.","");
  BinderException::BinderException(pBVar8,(string *)&local_b0);
  __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}